

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem2der.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint ret;
  char *pcVar2;
  FILE *pFVar3;
  size_t sVar4;
  uchar *input;
  size_t sVar5;
  options *poVar6;
  char *pcVar7;
  ulong uVar8;
  size_t der_size;
  char buf [1024];
  uchar der_buffer [4096];
  size_t local_1440;
  char local_1438 [1024];
  uchar local_1038 [4104];
  
  local_1440 = 0x1000;
  memset(local_1438,0,0x400);
  memset(local_1038,0,0x1000);
  if (argc == 0) {
LAB_00101547:
    input = (uchar *)0x0;
    printf(
          "\n usage: pem2der param=<>...\n\n acceptable parameters:\n    filename=%%s         default: file.pem\n    output_file=%%s      default: file.der\n\n"
          );
  }
  else {
    opt.filename = "file.pem";
    opt.output_file = "file.der";
    if (1 < argc) {
      uVar8 = 1;
      do {
        pcVar7 = argv[uVar8];
        pcVar2 = strchr(pcVar7,0x3d);
        if (pcVar2 == (char *)0x0) goto LAB_00101547;
        *pcVar2 = '\0';
        iVar1 = strcmp(pcVar7,"filename");
        poVar6 = &opt;
        if (iVar1 != 0) {
          iVar1 = strcmp(pcVar7,"output_file");
          poVar6 = (options *)&opt.output_file;
          if (iVar1 != 0) goto LAB_00101547;
        }
        poVar6->filename = pcVar2 + 1;
        uVar8 = uVar8 + 1;
      } while ((uint)argc != uVar8);
    }
    printf("\n  . Loading the PEM file ...");
    fflush(_stdout);
    pFVar3 = fopen(opt.filename,"rb");
    if (pFVar3 == (FILE *)0x0) {
LAB_0010156b:
      mbedtls_strerror(-1,local_1438,0x400);
      pcVar7 = " failed\n  !  load_file returned %d - %s\n\n";
      input = (uchar *)0x0;
LAB_0010158b:
      uVar8 = 0xffffffff;
    }
    else {
      fseek(pFVar3,0,2);
      sVar4 = ftell(pFVar3);
      if (sVar4 == 0xffffffffffffffff) {
LAB_00101559:
        fclose(pFVar3);
        goto LAB_0010156b;
      }
      fseek(pFVar3,0,0);
      input = (uchar *)calloc(1,sVar4 + 1);
      if (input == (uchar *)0x0) goto LAB_00101559;
      sVar5 = fread(input,1,sVar4,pFVar3);
      fclose(pFVar3);
      if (sVar5 != sVar4) {
        free(input);
        goto LAB_0010156b;
      }
      input[sVar4] = '\0';
      puts(" ok");
      printf("  . Converting from PEM to DER ...");
      fflush(_stdout);
      ret = convert_pem_to_der(input,sVar4,local_1038,&local_1440);
      if (ret == 0) {
        puts(" ok");
        printf("  . Writing the DER file ...");
        fflush(_stdout);
        sVar4 = local_1440;
        pFVar3 = fopen(opt.output_file,"wb");
        if (pFVar3 != (FILE *)0x0) {
          sVar5 = fwrite(local_1038,1,sVar4,pFVar3);
          fclose(pFVar3);
          if (sVar5 == sVar4) {
            puts(" ok");
            iVar1 = 0;
            goto LAB_0010159f;
          }
        }
        mbedtls_strerror(-1,local_1438,0x400);
        pcVar7 = " failed\n  !  write_file returned %d - %s\n\n";
        goto LAB_0010158b;
      }
      mbedtls_strerror(ret,local_1438,0x400);
      pcVar7 = " failed\n  !  convert_pem_to_der %d - %s\n\n";
      uVar8 = (ulong)ret;
    }
    printf(pcVar7,uVar8,local_1438);
  }
  iVar1 = 1;
LAB_0010159f:
  free(input);
  return iVar1;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    unsigned char *pem_buffer = NULL;
    unsigned char der_buffer[4096];
    char buf[1024];
    size_t pem_size, der_size = sizeof(der_buffer);
    int i;
    char *p, *q;

    /*
     * Set to sane values
     */
    memset( buf, 0, sizeof(buf) );
    memset( der_buffer, 0, sizeof(der_buffer) );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto exit;
    }

    opt.filename            = DFL_FILENAME;
    opt.output_file         = DFL_OUTPUT_FILENAME;

    for( i = 1; i < argc; i++ )
    {

        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "output_file" ) == 0 )
            opt.output_file = q;
        else
            goto usage;
    }

    /*
     * 1.1. Load the PEM file
     */
    mbedtls_printf( "\n  . Loading the PEM file ..." );
    fflush( stdout );

    ret = load_file( opt.filename, &pem_buffer, &pem_size );

    if( ret != 0 )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, 1024 );
#endif
        mbedtls_printf( " failed\n  !  load_file returned %d - %s\n\n", ret, buf );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1.2. Convert from PEM to DER
     */
    mbedtls_printf( "  . Converting from PEM to DER ..." );
    fflush( stdout );

    if( ( ret = convert_pem_to_der( pem_buffer, pem_size, der_buffer, &der_size ) ) != 0 )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, 1024 );
#endif
        mbedtls_printf( " failed\n  !  convert_pem_to_der %d - %s\n\n", ret, buf );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1.3. Write the DER file
     */
    mbedtls_printf( "  . Writing the DER file ..." );
    fflush( stdout );

    ret = write_file( opt.output_file, der_buffer, der_size );

    if( ret != 0 )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, 1024 );
#endif
        mbedtls_printf( " failed\n  !  write_file returned %d - %s\n\n", ret, buf );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    free( pem_buffer );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}